

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push.c
# Opt level: O1

void push0_recv_cb(void *arg)

{
  nni_aio *aio;
  nng_err nVar1;
  nni_msg *m;
  
  aio = (nni_aio *)((long)arg + 0x20);
  nVar1 = nni_aio_result(aio);
  if (nVar1 != NNG_OK) {
    nni_pipe_close(*arg);
    return;
  }
  m = nni_aio_get_msg(aio);
  nni_msg_free(m);
  nni_aio_set_msg(aio,(nni_msg *)0x0);
  nni_pipe_recv(*arg,aio);
  return;
}

Assistant:

static void
push0_recv_cb(void *arg)
{
	push0_pipe *p = arg;

	// We normally expect to receive an error.  If a pipe actually
	// sends us data, we just discard it.
	if (nni_aio_result(&p->aio_recv) != 0) {
		nni_pipe_close(p->pipe);
		return;
	}
	nni_msg_free(nni_aio_get_msg(&p->aio_recv));
	nni_aio_set_msg(&p->aio_recv, NULL);
	nni_pipe_recv(p->pipe, &p->aio_recv);
}